

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Constraint::operator==(Constraint *this,Constraint *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SENode *pSVar4;
  DependenceLine *pDVar5;
  ScalarEvolutionAnalysis *this_00;
  SENode *pSVar6;
  SENode *pSVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DependenceLine *this_01;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  bool local_d9;
  bool local_b9;
  bool local_81;
  DependenceDistance *local_80;
  DependencePoint *other_point;
  DependencePoint *this_point;
  DependenceLine *other_line;
  DependenceLine *this_line;
  SENode *neg_distance;
  ScalarEvolutionAnalysis *scalar_evolution;
  DependenceLine *line;
  SENode *distance;
  DependenceDistance *as_distance;
  bool is_distance;
  Constraint *other_local;
  Constraint *this_local;
  undefined4 extraout_var_02;
  undefined4 extraout_var_08;
  
  iVar2 = (**this->_vptr_Constraint)();
  if (((iVar2 == 1) && (iVar2 = (**other->_vptr_Constraint)(), iVar2 == 0)) ||
     ((iVar2 = (**this->_vptr_Constraint)(), iVar2 == 0 &&
      (iVar2 = (**other->_vptr_Constraint)(), iVar2 == 1)))) {
    iVar2 = (*this->_vptr_Constraint[4])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      iVar2 = (*other->_vptr_Constraint[6])();
      local_80 = (DependenceDistance *)CONCAT44(extraout_var_01,iVar2);
    }
    else {
      iVar2 = (*this->_vptr_Constraint[6])();
      local_80 = (DependenceDistance *)CONCAT44(extraout_var_00,iVar2);
    }
    pSVar4 = DependenceDistance::GetDistance(local_80);
    iVar2 = (*other->_vptr_Constraint[4])();
    pDVar5 = (DependenceLine *)CONCAT44(extraout_var_02,iVar2);
    this_00 = SENode::GetParentAnalysis(pSVar4);
    pSVar4 = ScalarEvolutionAnalysis::CreateNegation(this_00,pSVar4);
    pSVar4 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar4);
    pSVar6 = ScalarEvolutionAnalysis::CreateConstant(this_00,1);
    pSVar7 = DependenceLine::GetA(pDVar5);
    bVar1 = SENode::operator==(pSVar6,pSVar7);
    local_81 = false;
    if (bVar1) {
      pSVar6 = ScalarEvolutionAnalysis::CreateConstant(this_00,-1);
      pSVar7 = DependenceLine::GetB(pDVar5);
      bVar1 = SENode::operator==(pSVar6,pSVar7);
      local_81 = false;
      if (bVar1) {
        pSVar6 = DependenceLine::GetC(pDVar5);
        local_81 = SENode::operator==(pSVar4,pSVar6);
      }
    }
    this_local._7_1_ = local_81;
  }
  else {
    iVar2 = (**this->_vptr_Constraint)();
    iVar3 = (**other->_vptr_Constraint)();
    if (iVar2 == iVar3) {
      iVar2 = (*this->_vptr_Constraint[6])();
      if (CONCAT44(extraout_var_03,iVar2) == 0) {
        iVar2 = (*this->_vptr_Constraint[4])();
        if (CONCAT44(extraout_var_06,iVar2) == 0) {
          iVar2 = (*this->_vptr_Constraint[8])();
          if (CONCAT44(extraout_var_09,iVar2) == 0) {
            this_local._7_1_ = true;
          }
          else {
            iVar2 = (*this->_vptr_Constraint[8])();
            iVar3 = (*other->_vptr_Constraint[8])();
            pSVar4 = DependencePoint::GetSource((DependencePoint *)CONCAT44(extraout_var_10,iVar2));
            pSVar6 = DependencePoint::GetSource((DependencePoint *)CONCAT44(extraout_var_11,iVar3));
            bVar1 = SENode::operator==(pSVar4,pSVar6);
            local_d9 = false;
            if (bVar1) {
              pSVar4 = DependencePoint::GetDestination
                                 ((DependencePoint *)CONCAT44(extraout_var_10,iVar2));
              pSVar6 = DependencePoint::GetDestination
                                 ((DependencePoint *)CONCAT44(extraout_var_11,iVar3));
              local_d9 = SENode::operator==(pSVar4,pSVar6);
            }
            this_local._7_1_ = local_d9;
          }
        }
        else {
          iVar2 = (*this->_vptr_Constraint[4])();
          pDVar5 = (DependenceLine *)CONCAT44(extraout_var_07,iVar2);
          iVar2 = (*other->_vptr_Constraint[4])();
          this_01 = (DependenceLine *)CONCAT44(extraout_var_08,iVar2);
          pSVar4 = DependenceLine::GetA(pDVar5);
          pSVar6 = DependenceLine::GetA(this_01);
          bVar1 = SENode::operator==(pSVar4,pSVar6);
          local_b9 = false;
          if (bVar1) {
            pSVar4 = DependenceLine::GetB(pDVar5);
            pSVar6 = DependenceLine::GetB(this_01);
            bVar1 = SENode::operator==(pSVar4,pSVar6);
            local_b9 = false;
            if (bVar1) {
              pSVar4 = DependenceLine::GetC(pDVar5);
              pSVar6 = DependenceLine::GetC(this_01);
              local_b9 = SENode::operator==(pSVar4,pSVar6);
            }
          }
          this_local._7_1_ = local_b9;
        }
      }
      else {
        iVar2 = (*this->_vptr_Constraint[6])();
        pSVar4 = DependenceDistance::GetDistance
                           ((DependenceDistance *)CONCAT44(extraout_var_04,iVar2));
        iVar2 = (*other->_vptr_Constraint[6])();
        pSVar6 = DependenceDistance::GetDistance
                           ((DependenceDistance *)CONCAT44(extraout_var_05,iVar2));
        this_local._7_1_ = SENode::operator==(pSVar4,pSVar6);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Constraint::operator==(const Constraint& other) const {
  // A distance of |d| is equivalent to a line |x - y = -d|
  if ((GetType() == ConstraintType::Distance &&
       other.GetType() == ConstraintType::Line) ||
      (GetType() == ConstraintType::Line &&
       other.GetType() == ConstraintType::Distance)) {
    auto is_distance = AsDependenceLine() != nullptr;

    auto as_distance =
        is_distance ? AsDependenceDistance() : other.AsDependenceDistance();
    auto distance = as_distance->GetDistance();

    auto line = other.AsDependenceLine();

    auto scalar_evolution = distance->GetParentAnalysis();

    auto neg_distance = scalar_evolution->SimplifyExpression(
        scalar_evolution->CreateNegation(distance));

    return *scalar_evolution->CreateConstant(1) == *line->GetA() &&
           *scalar_evolution->CreateConstant(-1) == *line->GetB() &&
           *neg_distance == *line->GetC();
  }

  if (GetType() != other.GetType()) {
    return false;
  }

  if (AsDependenceDistance()) {
    return *AsDependenceDistance()->GetDistance() ==
           *other.AsDependenceDistance()->GetDistance();
  }

  if (AsDependenceLine()) {
    auto this_line = AsDependenceLine();
    auto other_line = other.AsDependenceLine();
    return *this_line->GetA() == *other_line->GetA() &&
           *this_line->GetB() == *other_line->GetB() &&
           *this_line->GetC() == *other_line->GetC();
  }

  if (AsDependencePoint()) {
    auto this_point = AsDependencePoint();
    auto other_point = other.AsDependencePoint();

    return *this_point->GetSource() == *other_point->GetSource() &&
           *this_point->GetDestination() == *other_point->GetDestination();
  }

  return true;
}